

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *in,QRegularExpression *re)

{
  QFlagsStorage<QRegularExpression::PatternOption> QVar1;
  QDataStream *this;
  QRegularExpressionPrivate *pQVar2;
  long in_FS_OFFSET;
  quint32 patternOptions;
  QFlagsStorage<QRegularExpression::PatternOption> local_3c;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  local_3c.i = 0xaaaaaaaa;
  this = operator>>(in,&local_38);
  QDataStream::operator>>(this,(qint32 *)&local_3c);
  QRegularExpression::setPattern(re,&local_38);
  QVar1.i = local_3c.i;
  pQVar2 = (re->d).d.ptr;
  if ((pQVar2->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
      super_QFlagsStorage<QRegularExpression::PatternOption>.i != local_3c.i) {
    if ((__atomic_base<int>)
        *(__int_type_conflict *)
         &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QExplicitlySharedDataPointer<QRegularExpressionPrivate>::detach_helper(&re->d);
      pQVar2 = (re->d).d.ptr;
    }
    pQVar2->isDirty = true;
    (pQVar2->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i = QVar1.i;
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QRegularExpression &re)
{
    QString pattern;
    quint32 patternOptions;
    in >> pattern >> patternOptions;
    re.setPattern(pattern);
    re.setPatternOptions(QRegularExpression::PatternOptions::fromInt(patternOptions));
    return in;
}